

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::_::CidrRange::CidrRange(CidrRange *this,StringPtr pattern)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  StringPtr *pSVar4;
  ulong uVar5;
  size_t sVar6;
  ulong elementCount;
  size_t __n;
  char *__s;
  char *ptrCopy;
  StringPtr *__cp;
  undefined8 *puVar7;
  Fault f;
  StringPtr pattern_local;
  Array<char> addr_heap;
  char addr_stack [128];
  
  sVar6 = pattern.content.size_;
  __s = pattern.content.ptr;
  pattern_local.content.ptr = __s;
  pattern_local.content.size_ = sVar6;
  pvVar3 = memchr(__s,0x2f,sVar6 - 1);
  if (pvVar3 == (void *)0x0) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
              ((Fault *)addr_stack,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x7cb,FAILED,"pattern.findFirst(\'/\') != nullptr","\"invalid CIDR\", pattern",
               (char (*) [13])"invalid CIDR",&pattern_local);
    Debug::Fault::fatal((Fault *)addr_stack);
  }
  __n = (long)pvVar3 - (long)__s;
  elementCount = __n + 1;
  addr_stack._0_8_ = (long)pvVar3 + 1;
  addr_stack._8_8_ = sVar6 - elementCount;
  uVar1 = StringPtr::parseAs<unsigned_int>((StringPtr *)addr_stack);
  this->bitCount = uVar1;
  if (elementCount < 0x81) {
    puVar7 = (undefined8 *)0x0;
    elementCount = 0;
    pSVar4 = (StringPtr *)0x0;
    __cp = (StringPtr *)addr_stack;
  }
  else {
    pSVar4 = (StringPtr *)
             HeapArrayDisposer::allocateImpl
                       (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    puVar7 = &HeapArrayDisposer::instance;
    __cp = pSVar4;
  }
  memcpy(__cp,pattern_local.content.ptr,__n);
  *(undefined1 *)((long)__cp + __n) = 0;
  pvVar3 = memchr(pattern_local.content.ptr,0x3a,pattern_local.content.size_ - 1);
  if (pvVar3 == (void *)0x0) {
    this->family = 2;
    iVar2 = 2;
    if (0x20 < this->bitCount) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x7d5,FAILED,"bitCount <= 32","\"invalid CIDR\", pattern",
                 (char (*) [13])"invalid CIDR",&pattern_local);
      Debug::Fault::fatal(&f);
    }
  }
  else {
    this->family = 10;
    iVar2 = 10;
    if (0x80 < this->bitCount) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x7d8,FAILED,"bitCount <= 128","\"invalid CIDR\", pattern",
                 (char (*) [13])"invalid CIDR",&pattern_local);
      Debug::Fault::fatal(&f);
    }
  }
  iVar2 = inet_pton(iVar2,(char *)__cp,this->bits);
  if (0 < iVar2) {
    uVar1 = this->bitCount;
    if (uVar1 < 0x80) {
      this->bits[uVar1 >> 3] = this->bits[uVar1 >> 3] & (byte)(0xff00 >> ((byte)uVar1 & 7));
      uVar5 = (ulong)(this->bitCount >> 3);
      memset(this->bits + uVar5 + 1,0,0xf - uVar5);
    }
    if (pSVar4 != (StringPtr *)0x0) {
      (**(code **)*puVar7)(puVar7,pSVar4,1,elementCount,elementCount,0);
    }
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x7db,FAILED,"inet_pton(family, addr.begin(), bits) > 0","\"invalid CIDR\", pattern",
             (char (*) [13])"invalid CIDR",&pattern_local);
  Debug::Fault::fatal(&f);
}

Assistant:

CidrRange::CidrRange(StringPtr pattern) {
  size_t slashPos = KJ_REQUIRE_NONNULL(pattern.findFirst('/'), "invalid CIDR", pattern);

  bitCount = pattern.slice(slashPos + 1).parseAs<uint>();

  KJ_STACK_ARRAY(char, addr, slashPos + 1, 128, 128);
  memcpy(addr.begin(), pattern.begin(), slashPos);
  addr[slashPos] = '\0';

  if (pattern.findFirst(':') == nullptr) {
    family = AF_INET;
    KJ_REQUIRE(bitCount <= 32, "invalid CIDR", pattern);
  } else {
    family = AF_INET6;
    KJ_REQUIRE(bitCount <= 128, "invalid CIDR", pattern);
  }

  KJ_ASSERT(inet_pton(family, addr.begin(), bits) > 0, "invalid CIDR", pattern);
  zeroIrrelevantBits();
}